

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trivialre.h
# Opt level: O2

Matcher * __thiscall
trivialre::re_compiler::C<trivialre::matchers::MatcherBuilder,_trivialre::re_compiler::ErrorPolicy>
::MaybeSeq(Matcher *__return_storage_ptr__,
          C<trivialre::matchers::MatcherBuilder,_trivialre::re_compiler::ErrorPolicy> *this,
          Matcher *left,
          optional<std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool,_const_std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)>_&)>_>
          *right)

{
  _Manager_type p_Var1;
  function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool,_const_std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)>_&)>
  *pfVar2;
  _Any_data local_58;
  _Manager_type local_48;
  _Invoker_type local_40;
  _Any_data local_38;
  _Manager_type local_28;
  _Invoker_type local_20;
  
  if ((right->
      super__Optional_base<std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool,_const_std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)>_&)>,_false,_false>
      )._M_payload.
      super__Optional_payload<std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool,_const_std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)>_&)>,_true,_false,_false>
      .
      super__Optional_payload_base<std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool,_const_std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)>_&)>_>
      ._M_engaged == true) {
    local_58._M_unused._M_object = (void *)0x0;
    local_58._8_8_ = 0;
    local_48 = (_Manager_type)0x0;
    local_40 = left->_M_invoker;
    p_Var1 = (left->super__Function_base)._M_manager;
    if (p_Var1 != (_Manager_type)0x0) {
      local_58._M_unused._0_8_ = (undefined8)*(undefined8 *)&(left->super__Function_base)._M_functor
      ;
      local_58._8_8_ = *(undefined8 *)((long)&(left->super__Function_base)._M_functor + 8);
      (left->super__Function_base)._M_manager = (_Manager_type)0x0;
      left->_M_invoker = (_Invoker_type)0x0;
      local_48 = p_Var1;
    }
    pfVar2 = std::
             optional<std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool,_const_std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)>_&)>_>
             ::value(right);
    local_38._M_unused._M_object = (void *)0x0;
    local_38._8_8_ = 0;
    local_28 = (_Manager_type)0x0;
    local_20 = pfVar2->_M_invoker;
    p_Var1 = (pfVar2->super__Function_base)._M_manager;
    if (p_Var1 != (_Manager_type)0x0) {
      local_38._M_unused._0_8_ =
           (undefined8)*(undefined8 *)&(pfVar2->super__Function_base)._M_functor;
      local_38._8_8_ = *(undefined8 *)((long)&(pfVar2->super__Function_base)._M_functor + 8);
      (pfVar2->super__Function_base)._M_manager = (_Manager_type)0x0;
      pfVar2->_M_invoker = (_Invoker_type)0x0;
      local_28 = p_Var1;
    }
    matchers::MatcherBuilder::Seq(__return_storage_ptr__,(Matcher *)&local_58,(Matcher *)&local_38);
    std::_Function_base::~_Function_base((_Function_base *)&local_38);
    std::_Function_base::~_Function_base((_Function_base *)&local_58);
  }
  else {
    std::
    function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool,_const_std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)>_&)>
    ::function(__return_storage_ptr__,left);
  }
  return __return_storage_ptr__;
}

Assistant:

Matcher MaybeSeq(Matcher left, std::optional<Matcher> right) {
    if (right) {
      return builder.Seq(std::move(left), std::move(right.value()));
    }
    return left;
  }